

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanMemoryManager.hpp
# Opt level: O3

void __thiscall
VulkanUtilities::VulkanMemoryPage::VulkanMemoryPage(VulkanMemoryPage *this,VulkanMemoryPage *rhs)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  void *pvVar3;
  
  this->m_ParentMemoryMgr = rhs->m_ParentMemoryMgr;
  (this->m_Mutex).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->m_Mutex).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->m_Mutex).super___mutex_base._M_mutex + 0x10) = 0;
  (this->m_Mutex).super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  (this->m_Mutex).super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  Diligent::VariableSizeAllocationsManager::VariableSizeAllocationsManager
            (&this->m_AllocationMgr,&rhs->m_AllocationMgr);
  (this->m_VkMemory).m_pLogicalDevice.
  super___shared_ptr<const_VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  peVar1 = (rhs->m_VkMemory).m_pLogicalDevice.
           super___shared_ptr<const_VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  p_Var2 = (rhs->m_VkMemory).m_pLogicalDevice.
           super___shared_ptr<const_VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
  (rhs->m_VkMemory).m_pLogicalDevice.
  super___shared_ptr<const_VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->m_VkMemory).m_pLogicalDevice.
  super___shared_ptr<const_VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = peVar1;
  (this->m_VkMemory).m_pLogicalDevice.
  super___shared_ptr<const_VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var2;
  (rhs->m_VkMemory).m_pLogicalDevice.
  super___shared_ptr<const_VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)0x0;
  pvVar3 = rhs->m_CPUMemory;
  (this->m_VkMemory).m_VkObject = (rhs->m_VkMemory).m_VkObject;
  this->m_CPUMemory = pvVar3;
  (rhs->m_VkMemory).m_VkObject = (VkDeviceMemory_T *)0x0;
  rhs->m_CPUMemory = (void *)0x0;
  return;
}

Assistant:

VulkanMemoryPage(VulkanMemoryPage&& rhs)noexcept :
        m_ParentMemoryMgr {rhs.m_ParentMemoryMgr         },
        m_AllocationMgr   {std::move(rhs.m_AllocationMgr)},
        m_VkMemory        {std::move(rhs.m_VkMemory)     },
        m_CPUMemory       {rhs.m_CPUMemory               }
    {
        rhs.m_CPUMemory = nullptr;
    }